

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::ChooseConfigCase::fillDontCare
          (ChooseConfigCase *this,
          vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
          *attributes)

{
  ulong uVar1;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *this_00;
  size_type sVar2;
  reference pvVar3;
  int local_34;
  pair<unsigned_int,_int> local_30;
  ulong local_28;
  size_t findNdx;
  bool found;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *pvStack_18;
  int ndx;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
  *attributes_local;
  ChooseConfigCase *this_local;
  
  pvStack_18 = attributes;
  attributes_local =
       (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *)this;
  for (findNdx._4_4_ = 0; findNdx._4_4_ < 4; findNdx._4_4_ = findNdx._4_4_ + 1) {
    findNdx._3_1_ = 0;
    local_28 = 0;
    while( true ) {
      uVar1 = local_28;
      sVar2 = std::
              vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
              size(pvStack_18);
      this_00 = pvStack_18;
      if (sVar2 <= uVar1) break;
      pvVar3 = std::
               vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
               ::operator[](pvStack_18,local_28);
      if (pvVar3->first == fillDontCare::dontCareAttributes[findNdx._4_4_]) {
        findNdx._3_1_ = 1;
      }
      local_28 = local_28 + 1;
    }
    if ((findNdx._3_1_ & 1) == 0) {
      local_34 = -1;
      local_30 = std::make_pair<unsigned_int_const&,int>
                           (fillDontCare::dontCareAttributes + findNdx._4_4_,&local_34);
      std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
      push_back(this_00,&local_30);
    }
  }
  return;
}

Assistant:

void fillDontCare (std::vector<std::pair<EGLenum, EGLint> >& attributes)
	{
		static const EGLenum dontCareAttributes[] =
		{
			EGL_TRANSPARENT_TYPE,
			EGL_COLOR_BUFFER_TYPE,
			EGL_RENDERABLE_TYPE,
			EGL_SURFACE_TYPE
		};

		// Fill appropriate unused attributes with EGL_DONT_CARE
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(dontCareAttributes); ndx++)
		{
			bool found = false;
			for (size_t findNdx = 0; findNdx < attributes.size(); findNdx++)
				if (attributes[findNdx].first == dontCareAttributes[ndx]) found = true;

			if (!found) attributes.push_back(std::make_pair(dontCareAttributes[ndx], EGL_DONT_CARE));
		}
	}